

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int attrset_set_attr(BigAttrSet *attrset,char *attrname,void *data,char *dtype,int nmemb)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  BigAttr *pBVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  
  attrset->dirty = 1;
  pcVar3 = strchr(attrname,0x20);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strchr(attrname,9);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strchr(attrname,10);
      if (pcVar3 == (char *)0x0) {
        pBVar4 = attrset_lookup_attr(attrset,attrname);
        if (pBVar4 != (BigAttr *)0x0) {
          attrset_remove_attr(attrset,attrname);
        }
        iVar2 = big_file_dtype_itemsize(dtype);
        sVar5 = strlen(attrname);
        uVar10 = sVar5 + (long)(iVar2 * nmemb) + 1;
        sVar9 = attrset->bufsize;
        while (sVar6 = attrset->bufused, sVar9 - sVar6 < uVar10) {
          pcVar3 = attrset->attrbuf;
          sVar6 = attrset->listused;
          lVar7 = -(long)pcVar3;
          lVar8 = 0x18;
          while (bVar12 = sVar6 != 0, sVar6 = sVar6 - 1, bVar12) {
            pBVar4 = attrset->attrlist;
            pcVar11 = pBVar4->dtype + lVar8 + -4;
            *(long *)pcVar11 = *(long *)pcVar11 + lVar7;
            pcVar11 = pBVar4->dtype + lVar8 + -0xc;
            *(long *)pcVar11 = *(long *)pcVar11 + lVar7;
            lVar8 = lVar8 + 0x20;
          }
          pcVar3 = (char *)realloc(pcVar3,sVar9 * 2);
          attrset->attrbuf = pcVar3;
          sVar6 = attrset->listused;
          sVar9 = attrset->bufsize * 2;
          attrset->bufsize = sVar9;
          lVar8 = 0x18;
          while (bVar12 = sVar6 != 0, sVar6 = sVar6 - 1, bVar12) {
            pBVar4 = attrset->attrlist;
            pcVar11 = pBVar4->dtype + lVar8 + -4;
            *(char **)pcVar11 = pcVar3 + *(long *)pcVar11;
            pcVar11 = pBVar4->dtype + lVar8 + -0xc;
            *(char **)pcVar11 = pcVar3 + *(long *)pcVar11;
            lVar8 = lVar8 + 0x20;
          }
        }
        pcVar3 = attrset->attrbuf;
        sVar9 = attrset->listsize;
        attrset->bufused = uVar10 + sVar6;
        while (sVar1 = attrset->listused, sVar9 == sVar1) {
          pBVar4 = (BigAttr *)realloc(attrset->attrlist,sVar9 << 6);
          attrset->attrlist = pBVar4;
          sVar9 = attrset->listsize * 2;
          attrset->listsize = sVar9;
        }
        pcVar3 = pcVar3 + sVar6;
        attrset->listused = sVar1 + 1;
        pBVar4 = attrset->attrlist + sVar1;
        pcVar11 = pBVar4->dtype;
        *(undefined8 *)(pBVar4->dtype + 4) = 0;
        pBVar4->name = (char *)0x0;
        pBVar4->data = (char *)0x0;
        pBVar4->nmemb = nmemb;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        _dtype_normalize(pcVar11,dtype);
        pBVar4->name = pcVar3;
        strcpy(pcVar3,attrname);
        sVar5 = strlen(attrname);
        pBVar4->data = pcVar3 + sVar5 + 1;
        qsort(attrset->attrlist,attrset->listused,0x20,attr_cmp);
        pBVar4 = attrset_lookup_attr(attrset,attrname);
        if (pBVar4->nmemb == nmemb) {
          iVar2 = dtype_convert_simple(pBVar4->data,pBVar4->dtype,data,dtype,(long)nmemb);
          return iVar2;
        }
        pcVar3 = "attr nmemb mismatch";
        iVar2 = 0x6d1;
        goto LAB_0010454d;
      }
    }
  }
  pcVar3 = "Attribute name cannot contain blanks (space, tab or newline)";
  iVar2 = 0x6c4;
LAB_0010454d:
  _big_file_raise(pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,iVar2);
  return -1;
}

Assistant:

static int
attrset_set_attr(BigAttrSet * attrset, const char * attrname, const void * data, const char * dtype, int nmemb)
{
    BigAttr * attr;
    attrset->dirty = 1;

    RAISEIF (
         strchr(attrname, ' ')
      || strchr(attrname, '\t')
      || strchr(attrname, '\n'),
      ex_name,
      "Attribute name cannot contain blanks (space, tab or newline)"
    );

    /* Remove it if it exists*/
    attr = attrset_lookup_attr(attrset, attrname);
    if(attr)
        attrset_remove_attr(attrset, attrname);
    /* add ensures the dtype has been normalized! */
    RAISEIF(0 != attrset_add_attr(attrset, attrname, dtype, nmemb),
            ex_add,
            "Failed to add attr");
    attr = attrset_lookup_attr(attrset, attrname);
    RAISEIF(attr->nmemb != nmemb,
            ex_mismatch,
            "attr nmemb mismatch");
    return dtype_convert_simple(attr->data, attr->dtype, data, dtype, attr->nmemb);

ex_name:
ex_mismatch:
ex_add:
    return -1;
}